

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node_struct *root,char_t *indent,uint flags,
               uint depth)

{
  uint uVar1;
  size_t indent_length;
  xml_node_struct *pxVar2;
  byte bVar3;
  char_t *extraout_RDX;
  char_t *extraout_RDX_00;
  char_t *extraout_RDX_01;
  char_t *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf;
  char_t *extraout_RDX_05;
  char_t *extraout_RDX_06;
  char_t *extraout_RDX_07;
  char_t *extraout_RDX_08;
  void *__buf_00;
  char_t *extraout_RDX_09;
  char_t *__buf_01;
  char *data;
  xml_node_struct *node;
  bool bVar5;
  byte bVar4;
  size_t __n;
  
  bVar4 = (byte)((flags & 4) >> 2);
  bVar3 = bVar4 | (flags & 0x41) == 0;
  __n = (size_t)bVar3;
  if (bVar3 == 0) {
    indent_length = strlength(indent);
    __buf_01 = extraout_RDX;
  }
  else {
    indent_length = 0;
    __buf_01 = indent;
  }
  bVar3 = 2;
  node = root;
  do {
    if (node == (xml_node_struct *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x10a6,
                    "void pugi::impl::(anonymous namespace)::node_output(xml_buffered_writer &, xml_node_struct *, const char_t *, unsigned int, unsigned int)"
                   );
    }
    if (((uint)node->header & 0xf) - 3 < 2) {
      node_output_simple(writer,node,flags);
      bVar3 = 0;
      __buf_01 = extraout_RDX_00;
LAB_00214b22:
      while ((pxVar2 = node, node != root &&
             (pxVar2 = node->next_sibling, node->next_sibling == (xml_node_struct *)0x0))) {
        node = node->parent;
        if ((node->header & 0xf) == 2) {
          if ((bVar3 & 1) != 0 && bVar4 == 0) {
            xml_buffered_writer::write(writer,10,__buf_01,__n);
          }
          depth = depth - 1;
          __n = CONCAT71((int7)(__n >> 8),bVar3 < 2 || indent_length == 0);
          if (bVar3 >= 2 && indent_length != 0) {
            __n = (size_t)depth;
            text_output_indent(writer,indent,indent_length,depth);
          }
          data = node->name;
          if (data == (char_t *)0x0) {
            data = ":anonymous";
          }
LAB_00214b9b:
          xml_buffered_writer::write(writer,0x3c,(void *)0x2f,__n);
LAB_00214ba9:
          xml_buffered_writer::write_string(writer,data);
          xml_buffered_writer::write(writer,0x3e,__buf_00,__n);
          __buf_01 = extraout_RDX_09;
LAB_00214bbf:
          bVar3 = 3;
        }
      }
    }
    else {
      if (((flags & 4) == 0) && ((bVar3 & 1) != 0)) {
        xml_buffered_writer::write(writer,10,__buf_01,__n);
        __buf_01 = extraout_RDX_01;
      }
      if ((indent_length != 0) && ((bVar3 & 2) != 0)) {
        __n = (size_t)depth;
        text_output_indent(writer,indent,indent_length,depth);
        __buf_01 = extraout_RDX_02;
      }
      uVar1 = (uint)node->header & 0xf;
      if (uVar1 == 1) {
        bVar3 = 2;
        pxVar2 = node->first_child;
        if (node->first_child == (xml_node_struct *)0x0) goto LAB_00214b22;
      }
      else {
        if (uVar1 != 2) {
          node_output_simple(writer,node,flags);
          __buf_01 = extraout_RDX_06;
          goto LAB_00214bbf;
        }
        data = node->name;
        if (data == (char_t *)0x0) {
          data = ":anonymous";
        }
        xml_buffered_writer::write(writer,0x3c,__buf_01,__n);
        xml_buffered_writer::write_string(writer,data);
        __buf = extraout_RDX_03;
        if (node->first_attribute != (xml_attribute_struct *)0x0) {
          __n = indent_length;
          node_output_attributes(writer,node,indent,indent_length,flags,depth);
          __buf = extraout_RDX_04;
        }
        if (node->value == (char_t *)0x0) {
          if (node->first_child == (xml_node_struct *)0x0) {
            if ((char)flags < '\0') {
              __n = 0x2f;
              xml_buffered_writer::write(writer,0x3e,(void *)0x3c,0x2f);
              goto LAB_00214ba9;
            }
            if ((flags & 4) == 0) {
              xml_buffered_writer::write(writer,0x20,__buf,__n);
            }
            xml_buffered_writer::write(writer,0x2f,(void *)0x3e,__n);
            __buf_01 = extraout_RDX_08;
            goto LAB_00214bbf;
          }
          xml_buffered_writer::write(writer,0x3e,__buf,__n);
          pxVar2 = node->first_child;
          __buf_01 = extraout_RDX_07;
        }
        else {
          xml_buffered_writer::write(writer,0x3e,__buf,__n);
          __n = (size_t)flags;
          text_output(writer,node->value,ctx_special_pcdata,flags);
          pxVar2 = node->first_child;
          __buf_01 = extraout_RDX_05;
          if (pxVar2 == (xml_node_struct *)0x0) goto LAB_00214b9b;
        }
        bVar5 = node->value == (char_t *)0x0;
        __n = (size_t)bVar5;
        bVar3 = bVar5 * '\x03';
        depth = depth + 1;
      }
    }
    node = pxVar2;
    if (pxVar2 == root) {
      if (((flags & 4) == 0) && ((bVar3 & 1) != 0)) {
        xml_buffered_writer::write(writer,10,__buf_01,__n);
        return;
      }
      return;
    }
  } while( true );
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, xml_node_struct* root, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		size_t indent_length = ((flags & (format_indent | format_indent_attributes)) && (flags & format_raw) == 0) ? strlength(indent) : 0;
		unsigned int indent_flags = indent_indent;

		xml_node_struct* node = root;

		do
		{
			assert(node);

			// begin writing current node
			if (PUGI__NODETYPE(node) == node_pcdata || PUGI__NODETYPE(node) == node_cdata)
			{
				node_output_simple(writer, node, flags);

				indent_flags = 0;
			}
			else
			{
				if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
					writer.write('\n');

				if ((indent_flags & indent_indent) && indent_length)
					text_output_indent(writer, indent, indent_length, depth);

				if (PUGI__NODETYPE(node) == node_element)
				{
					indent_flags = indent_newline | indent_indent;

					if (node_output_start(writer, node, indent, indent_length, flags, depth))
					{
						// element nodes can have value if parse_embed_pcdata was used
						if (node->value)
							indent_flags = 0;

						node = node->first_child;
						depth++;
						continue;
					}
				}
				else if (PUGI__NODETYPE(node) == node_document)
				{
					indent_flags = indent_indent;

					if (node->first_child)
					{
						node = node->first_child;
						continue;
					}
				}
				else
				{
					node_output_simple(writer, node, flags);

					indent_flags = indent_newline | indent_indent;
				}
			}

			// continue to the next node
			while (node != root)
			{
				if (node->next_sibling)
				{
					node = node->next_sibling;
					break;
				}

				node = node->parent;

				// write closing node
				if (PUGI__NODETYPE(node) == node_element)
				{
					depth--;

					if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
						writer.write('\n');

					if ((indent_flags & indent_indent) && indent_length)
						text_output_indent(writer, indent, indent_length, depth);

					node_output_end(writer, node);

					indent_flags = indent_newline | indent_indent;
				}
			}
		}
		while (node != root);

		if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
			writer.write('\n');
	}